

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O1

void Hop_TableInsert(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t **ppHVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t **ppHVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Hop_Obj_t *pHVar10;
  ulong uVar11;
  bool bVar12;
  timespec ts;
  timespec local_40;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                  ,0x67,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
  }
  pHVar3 = Hop_TableLookup(p,pObj);
  if (pHVar3 != (Hop_Obj_t *)0x0) {
    __assert_fail("Hop_TableLookup(p, pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                  ,0x68,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
  }
  if (((char)pObj->Id == '\0') && (p->nTableSize * 2 < p->nObjs[5] + p->nObjs[4])) {
    clock_gettime(3,&local_40);
    ppHVar6 = p->pTable;
    uVar1 = p->nTableSize;
    uVar7 = (p->nObjs[5] + p->nObjs[4]) * 2 - 1;
    while( true ) {
      do {
        uVar8 = uVar7 + 1;
        uVar2 = uVar7 & 1;
        uVar7 = uVar8;
      } while (uVar2 != 0);
      if (uVar8 < 9) break;
      iVar9 = 5;
      while (uVar8 % (iVar9 - 2U) != 0) {
        uVar2 = iVar9 * iVar9;
        iVar9 = iVar9 + 2;
        if (uVar8 < uVar2) goto LAB_007f5c7e;
      }
    }
LAB_007f5c7e:
    p->nTableSize = uVar8;
    ppHVar4 = (Hop_Obj_t **)malloc((long)(int)uVar8 << 3);
    p->pTable = ppHVar4;
    iVar9 = 0;
    memset(ppHVar4,0,(long)(int)uVar8 << 3);
    if (0 < (int)uVar1) {
      uVar11 = 0;
      iVar9 = 0;
      do {
        pHVar3 = ppHVar6[uVar11];
        if (pHVar3 != (Hop_Obj_t *)0x0) {
          pHVar10 = (pHVar3->field_1).pNext;
          do {
            ppHVar4 = Hop_TableFind(p,pHVar3);
            if (*ppHVar4 != (Hop_Obj_t *)0x0) {
              __assert_fail("*ppPlace == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                            ,0xbb,"void Hop_TableResize(Hop_Man_t *)");
            }
            *ppHVar4 = pHVar3;
            (pHVar3->field_1).pNext = (Hop_Obj_t *)0x0;
            if (pHVar10 == (Hop_Obj_t *)0x0) {
              pHVar5 = (Hop_Obj_t *)0x0;
            }
            else {
              pHVar5 = (pHVar10->field_1).pNext;
            }
            iVar9 = iVar9 + 1;
            bVar12 = pHVar10 != (Hop_Obj_t *)0x0;
            pHVar3 = pHVar10;
            pHVar10 = pHVar5;
          } while (bVar12);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar1);
    }
    if (iVar9 != p->nObjs[5] + p->nObjs[4]) {
      __assert_fail("Counter == nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                    ,0xc2,"void Hop_TableResize(Hop_Man_t *)");
    }
    if (ppHVar6 != (Hop_Obj_t **)0x0) {
      free(ppHVar6);
    }
  }
  ppHVar6 = Hop_TableFind(p,pObj);
  if (*ppHVar6 == (Hop_Obj_t *)0x0) {
    *ppHVar6 = pObj;
    return;
  }
  __assert_fail("*ppPlace == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                ,0x6c,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_TableInsert( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    Hop_Obj_t ** ppPlace;
    assert( !Hop_IsComplement(pObj) );
    assert( Hop_TableLookup(p, pObj) == NULL );
    if ( (pObj->Id & 0xFF) == 0 && 2 * p->nTableSize < Hop_ManNodeNum(p) )
        Hop_TableResize( p );
    ppPlace = Hop_TableFind( p, pObj );
    assert( *ppPlace == NULL );
    *ppPlace = pObj;
}